

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_02;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_03;
  int *piVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  string *psVar5;
  ulong uVar6;
  uint uVar7;
  MessageOptions *pMVar8;
  Type *proto_00;
  Type *proto_01;
  Type *pTVar9;
  Type *pTVar10;
  FieldDescriptor **ppFVar11;
  OneofOptions *pOVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ExtensionRange *proto_02;
  DescriptorBuilder *this_04;
  int i;
  long lVar16;
  int i_2;
  ulong uVar17;
  long lVar18;
  SubstituteArg local_268;
  SubstituteArg local_238;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_a8;
  SubstituteArg local_88;
  Descriptor *local_58;
  RepeatedPtrFieldBase *local_50;
  long local_48;
  DescriptorProto *local_40;
  DescriptorBuilder *local_38;
  
  local_38 = this;
  if (*(long *)(message + 0x20) == 0) {
    pMVar8 = MessageOptions::default_instance();
    *(MessageOptions **)(message + 0x20) = pMVar8;
  }
  lVar18 = 0;
  local_40 = proto;
  for (lVar16 = 0; lVar16 < *(int *)(message + 0x74); lVar16 = lVar16 + 1) {
    lVar14 = *(long *)(message + 0x38);
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(proto->nested_type_).super_RepeatedPtrFieldBase,(int)lVar16);
    CrossLinkMessage(local_38,(Descriptor *)(lVar14 + lVar18),proto_00);
    lVar18 = lVar18 + 0x90;
  }
  this_00 = &local_40->enum_type_;
  lVar18 = 0;
  for (lVar16 = 0; lVar16 < *(int *)(message + 0x78); lVar16 = lVar16 + 1) {
    lVar14 = *(long *)(message + 0x40);
    proto_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,(int)lVar16);
    CrossLinkEnum(local_38,(EnumDescriptor *)(lVar14 + lVar18),proto_01);
    lVar18 = lVar18 + 0x50;
  }
  this_01 = &local_40->field_;
  lVar18 = 0;
  for (lVar16 = 0; lVar16 < *(int *)(message + 0x68); lVar16 = lVar16 + 1) {
    lVar14 = *(long *)(message + 0x28);
    pTVar9 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&this_01->super_RepeatedPtrFieldBase,(int)lVar16);
    CrossLinkField(local_38,(FieldDescriptor *)(lVar14 + lVar18),pTVar9);
    lVar18 = lVar18 + 0x98;
  }
  this_02 = &local_40->extension_;
  lVar18 = 0;
  lVar16 = 0;
  local_50 = &this_01->super_RepeatedPtrFieldBase;
  for (; lVar16 < *(int *)(message + 0x80); lVar16 = lVar16 + 1) {
    lVar14 = *(long *)(message + 0x50);
    pTVar9 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&this_02->super_RepeatedPtrFieldBase,(int)lVar16);
    CrossLinkField(local_38,(FieldDescriptor *)(lVar14 + lVar18),pTVar9);
    lVar18 = lVar18 + 0x98;
  }
  this_03 = &local_40->extension_range_;
  lVar18 = 0;
  for (lVar16 = 0; lVar16 < *(int *)(message + 0x7c); lVar16 = lVar16 + 1) {
    lVar14 = *(long *)(message + 0x48);
    this_04 = (DescriptorBuilder *)this_03;
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
              (&this_03->super_RepeatedPtrFieldBase,(int)lVar16);
    CrossLinkExtensionRange(this_04,(ExtensionRange *)(lVar14 + lVar18),proto_02);
    lVar18 = lVar18 + 0x10;
  }
  lVar18 = -0x98;
  for (lVar16 = 0; lVar16 < *(int *)(message + 0x68); lVar16 = lVar16 + 1) {
    plVar3 = *(long **)(*(long *)(message + 0x28) + 0xf0 + lVar18);
    if (plVar3 != (long *)0x0) {
      if ((0 < (int)plVar3[3]) && (*(long **)(*(long *)(message + 0x28) + 0x58 + lVar18) != plVar3))
      {
        local_48 = lVar16;
        std::operator+(&local_f8,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (message + 8),".");
        std::operator+(&local_118,&local_f8,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (*(long *)(message + 0x28) + lVar18));
        pTVar9 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                           (local_50,(int)local_48 + -1);
        local_d8._M_dataplus._M_p = (pointer)**(undefined8 **)(*(long *)(message + 0x28) + lVar18);
        local_d8._M_string_length._0_4_ =
             *(undefined4 *)(*(undefined8 **)(*(long *)(message + 0x28) + lVar18) + 1);
        local_88.text_ = *(char **)*plVar3;
        local_88.size_ = *(int *)((undefined8 *)*plVar3 + 1);
        local_268.text_ = (char *)0x0;
        local_268.size_ = -1;
        local_238.text_ = (char *)0x0;
        local_238.size_ = -1;
        local_208.text_ = (char *)0x0;
        local_208.size_ = -1;
        local_1d8.text_ = (char *)0x0;
        local_1d8.size_ = -1;
        local_1a8.text_ = (char *)0x0;
        local_1a8.size_ = -1;
        local_178.text_ = (char *)0x0;
        local_178.size_ = -1;
        local_148.text_ = (char *)0x0;
        local_148.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_a8,
                   (strings *)
                   "Fields in the same oneof must be defined consecutively. \"$0\" cannot be defined before the completion of the \"$1\" oneof definition."
                   ,(char *)&local_d8,&local_88,(SubstituteArg *)&stack0xfffffffffffffd68,&local_268
                   ,&local_238,&local_208,&local_1d8,&local_1a8,&local_178,&local_148,
                   (SubstituteArg *)0x0);
        AddError(local_38,&local_118,&pTVar9->super_Message,TYPE,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_f8);
        lVar16 = local_48;
      }
      piVar1 = (int *)(*(long *)(message + 0x30) + 0x18 +
                      (long)(int)(((long)plVar3 - *(long *)(plVar3[2] + 0x30)) / 0x30) * 0x30);
      *piVar1 = *piVar1 + 1;
    }
    lVar18 = lVar18 + 0x98;
  }
  local_40 = (DescriptorProto *)&local_40->oneof_decl_;
  lVar16 = 0x28;
  local_58 = message;
  for (lVar18 = 0; lVar18 < *(int *)(message + 0x6c); lVar18 = lVar18 + 1) {
    lVar14 = *(long *)(message + 0x30);
    iVar2 = *(int *)(lVar14 + -0x10 + lVar16);
    if (iVar2 == 0) {
      local_48 = lVar18;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (message + 8),".");
      std::operator+(&local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (lVar14 + -0x28 + lVar16));
      pTVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                          ((RepeatedPtrFieldBase *)local_40,(int)local_48);
      AddError(local_38,&local_d8,&pTVar10->super_Message,NAME,"Oneof must have at least one field."
              );
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_88);
      iVar2 = *(int *)(lVar14 + -0x10 + lVar16);
      message = local_58;
      lVar18 = local_48;
    }
    ppFVar11 = DescriptorPool::Tables::AllocateArray<google::protobuf::FieldDescriptor_const*>
                         (local_38->tables_,iVar2);
    *(FieldDescriptor ***)(lVar14 + -8 + lVar16) = ppFVar11;
    *(undefined4 *)(lVar14 + -0x10 + lVar16) = 0;
    if (*(long *)(lVar14 + lVar16) == 0) {
      pOVar12 = OneofOptions::default_instance();
      *(OneofOptions **)(lVar14 + lVar16) = pOVar12;
    }
    lVar16 = lVar16 + 0x30;
  }
  uVar15 = *(uint *)(message + 0x68);
  lVar16 = 0;
  uVar13 = 0;
  if (0 < (int)uVar15) {
    uVar13 = (ulong)uVar15;
  }
  for (; uVar13 * 0x98 - lVar16 != 0; lVar16 = lVar16 + 0x98) {
    lVar18 = *(long *)(message + 0x28);
    lVar14 = *(long *)(lVar18 + 0x58 + lVar16);
    if (lVar14 != 0) {
      lVar4 = *(long *)(message + 0x30);
      lVar14 = (long)(int)((lVar14 - *(long *)(*(long *)(lVar14 + 0x10) + 0x30)) / 0x30) * 0x30;
      iVar2 = *(int *)(lVar4 + 0x18 + lVar14);
      *(int *)(lVar18 + 0x48 + lVar16) = iVar2;
      *(int *)(lVar4 + 0x18 + lVar14) = iVar2 + 1;
      *(long *)(*(long *)(lVar4 + 0x20 + lVar14) + (long)iVar2 * 8) = lVar18 + lVar16;
    }
  }
  lVar16 = 0x58;
  for (lVar18 = 0; lVar18 < (int)uVar15; lVar18 = lVar18 + 1) {
    if ((*(char *)(*(long *)(message + 0x28) + -0x17 + lVar16) == '\x01') &&
       (((lVar14 = *(long *)(*(long *)(message + 0x28) + lVar16), lVar14 == 0 ||
         (*(int *)(lVar14 + 0x18) != 1)) || (*(char *)(**(long **)(lVar14 + 0x20) + 0x41) == '\0')))
       ) {
      psVar5 = *(string **)(message + 8);
      pTVar9 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (local_50,(int)lVar18);
      AddError(local_38,psVar5,&pTVar9->super_Message,OTHER,
               "Fields with proto3_optional set must be a member of a one-field oneof");
      uVar15 = *(uint *)(message + 0x68);
    }
    lVar16 = lVar16 + 0x98;
  }
  uVar13 = 0xffffffffffffffff;
  lVar16 = 0x20;
  uVar17 = 0;
  while( true ) {
    uVar15 = (uint)uVar13;
    if ((long)(int)*(uint *)(message + 0x6c) <= (long)uVar17) break;
    if ((*(int *)(*(long *)(message + 0x30) + -8 + lVar16) == 1) &&
       (*(char *)(**(long **)(*(long *)(message + 0x30) + lVar16) + 0x41) == '\x01')) {
      uVar6 = uVar17;
      if (uVar15 != 0xffffffff) {
        uVar6 = uVar13;
      }
      uVar7 = (uint)uVar6;
    }
    else {
      uVar7 = 0xffffffff;
      if (uVar15 != 0xffffffff) {
        psVar5 = *(string **)(message + 8);
        pTVar10 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                            ((RepeatedPtrFieldBase *)local_40,(int)uVar17);
        AddError(local_38,psVar5,&pTVar10->super_Message,OTHER,
                 "Synthetic oneofs must be after all other oneofs");
        uVar7 = uVar15;
      }
    }
    uVar17 = uVar17 + 1;
    lVar16 = lVar16 + 0x30;
    uVar13 = (ulong)uVar7;
  }
  uVar7 = *(uint *)(message + 0x6c);
  if (uVar15 != 0xffffffff) {
    uVar7 = uVar15;
  }
  *(uint *)(message + 0x70) = uVar7;
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(Descriptor* message,
                                         const DescriptorProto& proto) {
  if (message->options_ == nullptr) {
    message->options_ = &MessageOptions::default_instance();
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->enum_type_count(); i++) {
    CrossLinkEnum(&message->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }

  for (int i = 0; i < message->extension_range_count(); i++) {
    CrossLinkExtensionRange(&message->extension_ranges_[i],
                            proto.extension_range(i));
  }

  // Set up field array for each oneof.

  // First count the number of fields per oneof.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      // Make sure fields belonging to the same oneof are defined consecutively.
      // This enables optimizations in codegens and reflection libraries to
      // skip fields in the oneof group, as only one of the field can be set.
      // Note that field_count() returns how many fields in this oneof we have
      // seen so far. field_count() > 0 guarantees that i > 0, so field(i-1) is
      // safe.
      if (oneof_decl->field_count() > 0 &&
          message->field(i - 1)->containing_oneof() != oneof_decl) {
        AddError(message->full_name() + "." + message->field(i - 1)->name(),
                 proto.field(i - 1), DescriptorPool::ErrorCollector::TYPE,
                 strings::Substitute(
                     "Fields in the same oneof must be defined consecutively. "
                     "\"$0\" cannot be defined before the completion of the "
                     "\"$1\" oneof definition.",
                     message->field(i - 1)->name(), oneof_decl->name()));
      }
      // Must go through oneof_decls_ array to get a non-const version of the
      // OneofDescriptor.
      ++message->oneof_decls_[oneof_decl->index()].field_count_;
    }
  }

  // Then allocate the arrays.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    OneofDescriptor* oneof_decl = &message->oneof_decls_[i];

    if (oneof_decl->field_count() == 0) {
      AddError(message->full_name() + "." + oneof_decl->name(),
               proto.oneof_decl(i), DescriptorPool::ErrorCollector::NAME,
               "Oneof must have at least one field.");
    }

    oneof_decl->fields_ = tables_->AllocateArray<const FieldDescriptor*>(
        oneof_decl->field_count_);
    oneof_decl->field_count_ = 0;

    if (oneof_decl->options_ == nullptr) {
      oneof_decl->options_ = &OneofOptions::default_instance();
    }
  }

  // Then fill them in.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      OneofDescriptor* mutable_oneof_decl =
          &message->oneof_decls_[oneof_decl->index()];
      message->fields_[i].index_in_oneof_ = mutable_oneof_decl->field_count_;
      mutable_oneof_decl->fields_[mutable_oneof_decl->field_count_++] =
          message->field(i);
    }
  }

  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if (field->proto3_optional_) {
      if (!field->containing_oneof() ||
          !field->containing_oneof()->is_synthetic()) {
        AddError(message->full_name(), proto.field(i),
                 DescriptorPool::ErrorCollector::OTHER,
                 "Fields with proto3_optional set must be "
                 "a member of a one-field oneof");
      }
    }
  }

  // Synthetic oneofs must be last.
  int first_synthetic = -1;
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    if (oneof->is_synthetic()) {
      if (first_synthetic == -1) {
        first_synthetic = i;
      }
    } else {
      if (first_synthetic != -1) {
        AddError(message->full_name(), proto.oneof_decl(i),
                 DescriptorPool::ErrorCollector::OTHER,
                 "Synthetic oneofs must be after all other oneofs");
      }
    }
  }

  if (first_synthetic == -1) {
    message->real_oneof_decl_count_ = message->oneof_decl_count_;
  } else {
    message->real_oneof_decl_count_ = first_synthetic;
  }
}